

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

void lj_debug_dumpstack(lua_State *L,SBuf *sb,char *fmt,int depth)

{
  char cVar1;
  int iVar2;
  int iVar3;
  cTValue *pcVar4;
  GCfunc *fn;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  int local_70;
  int size;
  lua_State *local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  char *local_50;
  cTValue *local_48;
  cTValue *local_40;
  char *name;
  
  local_5c = depth >> 0x1f | 1;
  uVar8 = 0xffffffff;
  if (depth < -1) {
    uVar8 = depth;
  }
  local_58 = 0xffffffff;
  if (-1 < depth) {
    local_58 = depth;
  }
  iVar3 = 1;
  local_70 = 0;
  local_68 = L;
  local_60 = depth;
  local_50 = fmt;
  for (uVar8 = ~uVar8; uVar8 != local_58; uVar8 = uVar8 + local_5c) {
    pcVar4 = lj_debug_frame(local_68,uVar8,&size);
    if (pcVar4 != (cTValue *)0x0) {
      local_48 = pcVar4 + size;
      if ((long)size == 0) {
        local_48 = (cTValue *)0x0;
      }
      fn = (GCfunc *)(ulong)(pcVar4->u32).lo;
      pcVar9 = local_50;
      local_54 = uVar8;
      local_40 = pcVar4;
      iVar2 = iVar3;
LAB_001117e7:
      do {
        while( true ) {
          iVar3 = iVar2;
          cVar1 = *pcVar9;
          pcVar9 = pcVar9 + 1;
          iVar2 = iVar3;
          if (cVar1 != 'F') break;
LAB_00111838:
          pcVar6 = lj_debug_funcname(local_68,local_40,&name);
          if (pcVar6 == (char *)0x0) {
LAB_001118b2:
            if ((fn->c).ffid == '\x01') {
              uVar8 = (sb->p).ptr32;
              pcVar6 = (char *)(ulong)uVar8;
              if ((sb->e).ptr32 == uVar8) {
                pcVar6 = lj_buf_more2(sb,1);
              }
              *pcVar6 = '@';
              (sb->p).ptr32 = (int)pcVar6 + 1;
              lj_strfmt_putptr(sb,(fn->c).f);
            }
            else if ((fn->c).ffid == '\0') {
              uVar7 = (ulong)(fn->c).pc.ptr32;
              iVar3 = debug_putchunkname(sb,(GCproto *)(uVar7 - 0x40),iVar3);
              if (iVar3 != 0) {
                if (cVar1 == 'l') {
                  iVar3 = lj_debug_frameline(local_68,fn,local_48);
                }
                else {
                  iVar3 = *(int *)(uVar7 - 0x14);
                }
                uVar8 = (sb->p).ptr32;
                pcVar6 = (char *)(ulong)uVar8;
                if ((sb->e).ptr32 == uVar8) {
                  pcVar6 = lj_buf_more2(sb,1);
                }
                *pcVar6 = ':';
                (sb->p).ptr32 = (int)pcVar6 + 1;
                if (iVar3 < 0) {
                  iVar3 = *(int32_t *)(uVar7 - 0x14);
                }
                lj_strfmt_putint(sb,iVar3);
              }
            }
            else {
              lj_buf_putmem(sb,"[builtin#",9);
              lj_strfmt_putint(sb,(uint)(fn->c).ffid);
              uVar8 = (sb->p).ptr32;
              pcVar6 = (char *)(ulong)uVar8;
              if ((sb->e).ptr32 == uVar8) {
                pcVar6 = lj_buf_more2(sb,1);
              }
              iVar2 = (int)pcVar6;
              *pcVar6 = ']';
LAB_00111976:
              (sb->p).ptr32 = iVar2 + 1;
              iVar2 = iVar3;
            }
          }
          else {
            if (((cVar1 == 'F') && ((fn->c).ffid == '\0')) &&
               (uVar7 = (ulong)(fn->c).pc.ptr32, *(int *)(uVar7 - 0x14) != -1)) {
              debug_putchunkname(sb,(GCproto *)(uVar7 - 0x40),iVar3);
              uVar8 = (sb->p).ptr32;
              pcVar6 = (char *)(ulong)uVar8;
              if ((sb->e).ptr32 == uVar8) {
                pcVar6 = lj_buf_more2(sb,1);
              }
              *pcVar6 = ':';
              (sb->p).ptr32 = (int)pcVar6 + 1;
            }
            pcVar6 = name;
            sVar5 = strlen(name);
            lj_buf_putmem(sb,pcVar6,(MSize)sVar5);
          }
        }
        if (cVar1 != 'Z') {
          if (cVar1 == 'f') goto LAB_00111838;
          if (cVar1 == 'l') goto LAB_001118b2;
          iVar2 = 0;
          if (cVar1 == 'p') goto LAB_001117e7;
          uVar8 = local_54;
          if (cVar1 != '\0') {
            uVar8 = (sb->p).ptr32;
            pcVar6 = (char *)(ulong)uVar8;
            if ((sb->e).ptr32 == uVar8) {
              pcVar6 = lj_buf_more2(sb,1);
            }
            iVar2 = (int)pcVar6;
            *pcVar6 = cVar1;
            goto LAB_00111976;
          }
          goto LAB_00111a0f;
        }
        local_70 = (sb->p).ptr32 - (sb->b).ptr32;
      } while( true );
    }
    if (-1 < local_60) break;
    uVar8 = uVar8 - size;
LAB_00111a0f:
  }
  if (local_70 != 0) {
    (sb->p).ptr32 = local_70 + (sb->b).ptr32;
  }
  return;
}

Assistant:

void lj_debug_dumpstack(lua_State *L, SBuf *sb, const char *fmt, int depth)
{
  int level = 0, dir = 1, pathstrip = 1;
  MSize lastlen = 0;
  if (depth < 0) { level = ~depth; depth = dir = -1; }  /* Reverse frames. */
  while (level != depth) {  /* Loop through all frame. */
    int size;
    cTValue *frame = lj_debug_frame(L, level, &size);
    if (frame) {
      cTValue *nextframe = size ? frame+size : NULL;
      GCfunc *fn = frame_func(frame);
      const uint8_t *p = (const uint8_t *)fmt;
      int c;
      while ((c = *p++)) {
	switch (c) {
	case 'p':  /* Preserve full path. */
	  pathstrip = 0;
	  break;
	case 'F': case 'f': {  /* Dump function name. */
	  const char *name;
	  const char *what = lj_debug_funcname(L, frame, &name);
	  if (what) {
	    if (c == 'F' && isluafunc(fn)) {  /* Dump module:name for 'F'. */
	      GCproto *pt = funcproto(fn);
	      if (pt->firstline != ~(BCLine)0) {  /* Not a bytecode builtin. */
		debug_putchunkname(sb, pt, pathstrip);
		lj_buf_putb(sb, ':');
	      }
	    }
	    lj_buf_putmem(sb, name, (MSize)strlen(name));
	    break;
	  }  /* else: can't derive a name, dump module:line. */
	  }
	  /* fallthrough */
	case 'l':  /* Dump module:line. */
	  if (isluafunc(fn)) {
	    GCproto *pt = funcproto(fn);
	    if (debug_putchunkname(sb, pt, pathstrip)) {
	      /* Regular Lua function. */
	      BCLine line = c == 'l' ? lj_debug_frameline(L, fn, nextframe) :
				       pt->firstline;
	      lj_buf_putb(sb, ':');
	      lj_strfmt_putint(sb, line >= 0 ? line : pt->firstline);
	    }
	  } else if (isffunc(fn)) {  /* Dump numbered builtins. */
	    lj_buf_putmem(sb, "[builtin#", 9);
	    lj_strfmt_putint(sb, fn->c.ffid);
	    lj_buf_putb(sb, ']');
	  } else {  /* Dump C function address. */
	    lj_buf_putb(sb, '@');
	    lj_strfmt_putptr(sb, fn->c.f);
	  }
	  break;
	case 'Z':  /* Zap trailing separator. */
	  lastlen = sbuflen(sb);
	  break;
	default:
	  lj_buf_putb(sb, c);
	  break;
	}
      }
    } else if (dir == 1) {
      break;
    } else {
      level -= size;  /* Reverse frame order: quickly skip missing level. */
    }
    level += dir;
  }
  if (lastlen)
    setsbufP(sb, sbufB(sb) + lastlen);  /* Zap trailing separator. */
}